

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O2

string * __thiscall
libcellml::GeneratorProfile::openArrayString_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorProfile *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->mPimpl->mOpenArrayString);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorProfile::openArrayString() const
{
    return mPimpl->mOpenArrayString;
}